

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O0

uchar * pstore::storage::address_to_raw_pointer_impl<pstore::storage_const,unsigned_char_const*>
                  (storage *storage,address addr)

{
  bool bVar1;
  segment_type sVar2;
  offset_type oVar3;
  pointer this;
  size_type sVar4;
  type this_00;
  reference this_01;
  element_type *peVar5;
  sat_entry *e;
  segment_type segment;
  storage *storage_local;
  address addr_local;
  
  storage_local = (storage *)addr.a_;
  sVar2 = address::segment((address *)&storage_local);
  this = std::
         unique_ptr<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
         ::operator->(&storage->sat_);
  sVar4 = std::array<pstore::sat_entry,_65536UL>::size(this);
  if (sVar4 <= sVar2) {
    assert_failed("segment < storage.sat_->size ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/storage.hpp"
                  ,0x11d);
  }
  this_00 = std::
            unique_ptr<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
            ::operator*(&storage->sat_);
  this_01 = std::array<pstore::sat_entry,_65536UL>::operator[](this_00,(ulong)sVar2);
  bVar1 = sat_entry::is_valid(this_01);
  if (!bVar1) {
    assert_failed("e.is_valid ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/storage.hpp"
                  ,0x11f);
  }
  peVar5 = std::__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> *)this_01);
  oVar3 = address::offset((address *)&storage_local);
  return (uchar *)((long)peVar5 + (ulong)oVar3);
}

Assistant:

inline ResultType storage::address_to_raw_pointer_impl (Storage & storage,
                                                            address const addr) noexcept {

        address::segment_type const segment = addr.segment ();
        PSTORE_ASSERT (segment < storage.sat_->size ());
        sat_entry & e = (*storage.sat_)[segment];
        PSTORE_ASSERT (e.is_valid ());
        return static_cast<ResultType> (static_cast<std::uint8_t *> (e.value.get ()) +
                                        addr.offset ());
    }